

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_finish(FuncState *fs)

{
  byte *pbVar1;
  Proto *pPVar2;
  Instruction *pIVar3;
  int iVar4;
  uint uVar5;
  uint dest;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  
  if (0 < fs->pc) {
    pPVar2 = fs->f;
    uVar8 = 0;
    do {
      pIVar3 = pPVar2->code;
      uVar5 = pIVar3[uVar8] & 0x7f;
      if (uVar5 - 0x45 < 2) {
LAB_0011aba5:
        if (fs->needclose != '\0') {
          pbVar1 = (byte *)((long)pIVar3 + uVar8 * 4 + 1);
          *pbVar1 = *pbVar1 | 0x80;
        }
        if (pPVar2->is_vararg != '\0') {
          *(char *)((long)pIVar3 + uVar8 * 4 + 3) =
               (char)((uint)pPVar2->numparams * 0x1000000 + 0x1000000 >> 0x18);
        }
      }
      else if (uVar5 - 0x47 < 2) {
        if ((fs->needclose != '\0') || (pPVar2->is_vararg != '\0')) {
          pIVar3[uVar8] = pIVar3[uVar8] & 0xffffff80 | 0x46;
          goto LAB_0011aba5;
        }
      }
      else if (uVar5 == 0x38) {
        iVar4 = 99;
        uVar6 = uVar8 & 0xffffffff;
        do {
          uVar5 = pIVar3[(int)uVar6] & 0x7f;
          iVar7 = (pIVar3[(int)uVar6] >> 7) - 0xfffffe;
          if (uVar5 != 0x38) {
            iVar7 = 0;
          }
          dest = (int)uVar6 + iVar7;
          uVar6 = (ulong)dest;
          bVar9 = iVar4 != 0;
          iVar4 = iVar4 + -1;
        } while ((uVar5 == 0x38) && (bVar9));
        fixjump(fs,(int)uVar8,dest);
      }
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < (long)fs->pc);
  }
  return;
}

Assistant:

void luaK_finish (FuncState *fs) {
  int i;
  Proto *p = fs->f;
  for (i = 0; i < fs->pc; i++) {
    Instruction *pc = &p->code[i];
    lua_assert(i == 0 || isOT(*(pc - 1)) == isIT(*pc));
    switch (GET_OPCODE(*pc)) {
      case OP_RETURN0: case OP_RETURN1: {
        if (!(fs->needclose || p->is_vararg))
          break;  /* no extra work */
        /* else use OP_RETURN to do the extra work */
        SET_OPCODE(*pc, OP_RETURN);
      }  /* FALLTHROUGH */
      case OP_RETURN: case OP_TAILCALL: {
        if (fs->needclose)
          SETARG_k(*pc, 1);  /* signal that it needs to close */
        if (p->is_vararg)
          SETARG_C(*pc, p->numparams + 1);  /* signal that it is vararg */
        break;
      }
      case OP_JMP: {
        int target = finaltarget(p->code, i);
        fixjump(fs, i, target);
        break;
      }
      default: break;
    }
  }
}